

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O0

void __thiscall icu_63::anon_unknown_0::MutableCodePointTrie::clear(MutableCodePointTrie *this)

{
  MutableCodePointTrie *this_local;
  
  this->dataNullOffset = -1;
  this->index3NullOffset = -1;
  this->dataLength = 0;
  this->initialValue = this->origInitialValue;
  this->highValue = this->origInitialValue;
  this->highStart = 0;
  uprv_free_63(this->index16);
  this->index16 = (uint16_t *)0x0;
  return;
}

Assistant:

void MutableCodePointTrie::clear() {
    index3NullOffset = dataNullOffset = -1;
    dataLength = 0;
    highValue = initialValue = origInitialValue;
    highStart = 0;
    uprv_free(index16);
    index16 = nullptr;
}